

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

int Js::JavascriptString::IndexOfUsingJmpTable
              (Boyer_Moore_Jump *jmpTable,char16 *inputStr,charcount_t len,char16 *searchStr,
              int searchLen,int position)

{
  char16 cVar1;
  char16 cVar2;
  int iVar3;
  ulong uVar4;
  char16 *pcStack_48;
  WCHAR c;
  char16 *p;
  uint32 lMatchedJump;
  char16 searchLast;
  int result;
  int position_local;
  int searchLen_local;
  char16 *searchStr_local;
  charcount_t len_local;
  char16 *inputStr_local;
  Boyer_Moore_Jump *jmpTable_local;
  
  lMatchedJump = 0xffffffff;
  cVar1 = searchStr[searchLen + -1];
  p._4_4_ = searchLen;
  if (jmpTable[(ushort)cVar1].shift != 0) {
    p._4_4_ = jmpTable[(ushort)cVar1].shift;
  }
  for (pcStack_48 = inputStr + (long)position + (long)searchLen + -1; pcStack_48 < inputStr + len;
      pcStack_48 = pcStack_48 + uVar4) {
    if (*pcStack_48 == cVar1) {
      iVar3 = PAL_wmemcmp(pcStack_48 + (1 - (long)searchLen),searchStr,(long)searchLen);
      if (iVar3 == 0) break;
      uVar4 = (ulong)p._4_4_;
    }
    else {
      cVar2 = *pcStack_48;
      if (((cVar2 & 0xff80U) == 0) && (jmpTable[(ushort)cVar2].shift != 0)) {
        uVar4 = (ulong)jmpTable[(ushort)cVar2].shift;
      }
      else {
        uVar4 = (ulong)searchLen;
      }
    }
  }
  if ((inputStr + position <= pcStack_48) && (pcStack_48 < inputStr + len)) {
    lMatchedJump = ((int)((long)pcStack_48 - (long)inputStr >> 1) - searchLen) + 1;
  }
  return lMatchedJump;
}

Assistant:

int JavascriptString::IndexOfUsingJmpTable(JmpTable jmpTable, const char16* inputStr, charcount_t len, const char16* searchStr, int searchLen, int position)
    {
        int result = -1;

        const char16 searchLast = searchStr[searchLen-1];

        uint32 lMatchedJump = searchLen;
        if (jmpTable[searchLast].shift > 0)
        {
            lMatchedJump = jmpTable[searchLast].shift;
        }

        char16 const * p = inputStr + position + searchLen-1;
        WCHAR c;
        while(p < inputStr + len)
        {
            // first character match, keep checking
            if (*p == searchLast)
            {
                if ( wmemcmp(p-searchLen+1, searchStr, searchLen) == 0 )
                {
                    break;
                }
                p += lMatchedJump;
            }
            else
            {
                c = *p;
                if ( 0 == ( c & ~0x7f ) && jmpTable[c].shift != 0 )
                {
                    p += jmpTable[c].shift;
                }
                else
                {
                    p += searchLen;
                }
            }
        }

        if (p >= inputStr+position && p < inputStr + len)
        {
            result = (int)(p - inputStr) - searchLen + 1;
        }

        return result;
    }